

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

char * Diligent::GetShaderCodeBasicTypeString(SHADER_CODE_BASIC_TYPE Type)

{
  char *pcVar1;
  string msg;
  string local_28;
  
  if (Type < SHADER_CODE_BASIC_TYPE_COUNT) {
    pcVar1 = &DAT_00362268 + *(int *)(&DAT_00362268 + (ulong)Type * 4);
  }
  else {
    FormatString<char[35]>(&local_28,(char (*) [35])"Unknown/unsupported variable class");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetShaderCodeBasicTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x6b3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = "UNKNOWN";
  }
  return pcVar1;
}

Assistant:

const char* GetShaderCodeBasicTypeString(SHADER_CODE_BASIC_TYPE Type)
{
    static_assert(SHADER_CODE_BASIC_TYPE_COUNT == 21, "Did you add a new type? Please update the switch below.");
    switch (Type)
    {
        // clang-format off
        case SHADER_CODE_BASIC_TYPE_UNKNOWN:    return "unknown";
        case SHADER_CODE_BASIC_TYPE_VOID:       return "void";
        case SHADER_CODE_BASIC_TYPE_BOOL:       return "bool";
        case SHADER_CODE_BASIC_TYPE_INT:        return "int";
        case SHADER_CODE_BASIC_TYPE_INT8:       return "int8";
        case SHADER_CODE_BASIC_TYPE_INT16:      return "int16";
        case SHADER_CODE_BASIC_TYPE_INT64:      return "int64";
        case SHADER_CODE_BASIC_TYPE_UINT:       return "uint";
        case SHADER_CODE_BASIC_TYPE_UINT8:      return "uint8";
        case SHADER_CODE_BASIC_TYPE_UINT16:     return "uint16";
        case SHADER_CODE_BASIC_TYPE_UINT64:     return "uint64";
        case SHADER_CODE_BASIC_TYPE_FLOAT:      return "float";
        case SHADER_CODE_BASIC_TYPE_FLOAT16:    return "float16";
        case SHADER_CODE_BASIC_TYPE_DOUBLE:     return "double";
        case SHADER_CODE_BASIC_TYPE_MIN8FLOAT:  return "min8float";
        case SHADER_CODE_BASIC_TYPE_MIN10FLOAT: return "min10float";
        case SHADER_CODE_BASIC_TYPE_MIN16FLOAT: return "min16float";
        case SHADER_CODE_BASIC_TYPE_MIN12INT:   return "min12int";
        case SHADER_CODE_BASIC_TYPE_MIN16INT:   return "min16int";
        case SHADER_CODE_BASIC_TYPE_MIN16UINT:  return "min16uint";
        case SHADER_CODE_BASIC_TYPE_STRING:     return "string";
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported variable class"); return "UNKNOWN";
    }
}